

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::setModelData
          (QItemDelegate *this,QWidget *editor,QAbstractItemModel *model,QModelIndex *index)

{
  QItemDelegatePrivate *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  uint uVar3;
  char *pcVar4;
  QItemEditorFactory *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (*(code *)**(undefined8 **)editor)(editor);
  QMetaObject::userProperty();
  pcVar4 = (char *)QMetaProperty::name();
  QByteArray::QByteArray((QByteArray *)&local_78,pcVar4,-1);
  if ((undefined1 *)local_78.size == (undefined1 *)0x0) {
    pQVar5 = QItemDelegatePrivate::editorFactory(this_00);
    (**(code **)(*(long *)model + 0x90))(&local_58,model,index,2);
    uVar3 = ::QVariant::typeId(&local_58);
    (*pQVar5->_vptr_QItemEditorFactory[3])(&local_98,pQVar5,(ulong)uVar3);
    qVar2 = local_78.size;
    pcVar4 = local_78.ptr;
    pDVar1 = local_78.d;
    local_78.d = local_98.d;
    local_78.ptr = local_98.ptr;
    local_98.d = pDVar1;
    local_98.ptr = pcVar4;
    local_78.size = local_98.size;
    local_98.size = qVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
    ::QVariant::~QVariant(&local_58);
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) goto LAB_00504374;
  }
  QObject::property((char *)&local_58);
  (**(code **)(*(long *)model + 0x98))(model,index,&local_58,2);
  ::QVariant::~QVariant(&local_58);
LAB_00504374:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::setModelData(QWidget *editor,
                                 QAbstractItemModel *model,
                                 const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    Q_ASSERT(model);
    Q_ASSERT(editor);
    QByteArray n = editor->metaObject()->userProperty().name();
    if (n.isEmpty())
        n = d->editorFactory()->valuePropertyName(
            model->data(index, Qt::EditRole).userType());
    if (!n.isEmpty())
        model->setData(index, editor->property(n), Qt::EditRole);
}